

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O0

string * __thiscall
enact::CompileContext::getSourceLine_abi_cxx11_
          (string *__return_storage_ptr__,CompileContext *this,line_t line)

{
  bool bVar1;
  istream *piVar2;
  uint local_1a4;
  istringstream local_1a0 [4];
  line_t lineNumber;
  istringstream stream;
  line_t line_local;
  CompileContext *this_local;
  string *lineContents;
  
  std::__cxx11::istringstream::istringstream(local_1a0,this,8);
  local_1a4 = 1;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,(string *)__return_storage_ptr__);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1 || line <= local_1a4) break;
    local_1a4 = local_1a4 + 1;
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileContext::getSourceLine(line_t line) {
        std::istringstream stream{m_source};
        line_t lineNumber{1};
        std::string lineContents;

        while (std::getline(stream, lineContents) && lineNumber < line) {
            ++lineNumber;
        }

        return lineContents;
    }